

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint32_t __thiscall AmpIO::GetSafetyAmpDisable(AmpIO *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint local_18;
  uint local_14;
  uint i;
  uint32_t ampStatus;
  AmpIO *this_local;
  
  local_14 = 0;
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x514c4131) {
    uVar2 = GetStatus(this);
    local_14 = (uVar2 & 0xf0) >> 4;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x44514c41) {
      for (local_18 = 0; local_18 < this->NumMotors; local_18 = local_18 + 1) {
        bVar1 = GetSafetyAmpDisable(this,local_18);
        if (bVar1) {
          local_14 = 1 << ((byte)local_18 & 0x1f) | local_14;
        }
      }
    }
  }
  return local_14;
}

Assistant:

uint32_t AmpIO::GetSafetyAmpDisable(void) const
{
    uint32_t ampStatus = 0;
    if (GetHardwareVersion() == QLA1_String) {
        ampStatus = (GetStatus() & 0x000000F0) >> 4;
    }
    else if (GetHardwareVersion() == DQLA_String) {
        for (unsigned int i = 0; i < NumMotors; i++) {
            if (GetSafetyAmpDisable(i))
                ampStatus |= (1 << i);
        }
    }
    return ampStatus;
}